

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  string *__lhs;
  int iVar1;
  bool bVar2;
  __type _Var3;
  AlphaNum *in_R8;
  string_view message;
  string delimiter;
  allocator<char> local_e1;
  string_view local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  iVar1 = this->recursion_limit_;
  this->recursion_limit_ = iVar1 + -1;
  if (iVar1 < 1) {
    local_e0 = absl::lts_20250127::NullSafeStringView
                         (
                         "Message is too deep, the parser exceeded the configured recursion limit of "
                         );
    absl::lts_20250127::AlphaNum::AlphaNum(&local_90,this->initial_recursion_limit_);
    local_60.piece_ = absl::lts_20250127::NullSafeStringView(".");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b0,(lts_20250127 *)&local_e0,&local_90,&local_60,in_R8);
    message._M_str = local_b0._M_dataplus._M_p;
    message._M_len = local_b0._M_string_length;
    ReportError(this,message);
    std::__cxx11::string::~string((string *)&local_b0);
    bVar2 = false;
  }
  else {
    local_e0._M_str = (char *)0x0;
    local_e0._M_len = (size_t)local_d0;
    local_d0[0]._M_local_buf[0] = '\0';
    bVar2 = ConsumeMessageDelimiter(this,(string *)&local_e0);
    if (bVar2) {
      __lhs = &(this->tokenizer_).current_.text;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,">",(allocator<char> *)&local_b0);
        _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_90);
        if (_Var3) {
          std::__cxx11::string::~string((string *)&local_90);
LAB_002ae028:
          bVar2 = Consume(this,(string *)&local_e0);
          if (bVar2) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            bVar2 = true;
            goto LAB_002ae045;
          }
          break;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"}",&local_e1);
        _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_90);
        if (_Var3) goto LAB_002ae028;
        bVar2 = SkipField(this);
      } while (bVar2);
    }
    bVar2 = false;
LAB_002ae045:
    std::__cxx11::string::~string((string *)&local_e0);
  }
  return bVar2;
}

Assistant:

bool SkipFieldMessage() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));

    ++recursion_limit_;
    return true;
  }